

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forrest_tomlin.cc
# Opt level: O0

void __thiscall ipx::ForrestTomlin::_BtranForUpdate(ForrestTomlin *this,Int j,IndexedVector *lhs)

{
  double dVar1;
  size_type sVar2;
  double *pdVar3;
  reference pvVar4;
  IndexedVector *in_RDX;
  ForrestTomlin *in_RDI;
  Int p;
  Int k;
  Int num_updates;
  char *in_stack_00000068;
  char in_stack_00000077;
  Vector *in_stack_00000078;
  SparseMatrix *in_stack_00000080;
  Int in_stack_ffffffffffffff9c;
  IndexedVector *this_00;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar5;
  valarray<double> *in_stack_ffffffffffffffc0;
  double in_stack_ffffffffffffffc8;
  Int j_00;
  int local_24;
  int local_20;
  
  ComputeEta(in_RDI,(Int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  sVar2 = std::vector<int,_std::allocator<int>_>::size(&in_RDI->replaced_);
  local_20 = (int)sVar2;
  while (j_00 = (Int)((ulong)in_stack_ffffffffffffffc8 >> 0x20), local_20 = local_20 + -1,
        -1 < local_20) {
    iVar5 = local_20;
    std::valarray<double>::operator[](&in_RDI->work_,(long)(in_RDI->dim_ + local_20));
    ScatterColumn((SparseMatrix *)in_RDI,j_00,(double)in_stack_ffffffffffffffc0,
                  (Vector *)CONCAT44(iVar5,in_stack_ffffffffffffffb8));
    pdVar3 = std::valarray<double>::operator[](&in_RDI->work_,(long)(in_RDI->dim_ + local_20));
    in_stack_ffffffffffffffc8 = *pdVar3;
    in_stack_ffffffffffffffc0 = &in_RDI->work_;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->replaced_,(long)local_20);
    pdVar3 = std::valarray<double>::operator[](in_stack_ffffffffffffffc0,(long)*pvVar4);
    *pdVar3 = in_stack_ffffffffffffffc8;
    pdVar3 = std::valarray<double>::operator[](&in_RDI->work_,(long)(in_RDI->dim_ + local_20));
    *pdVar3 = 0.0;
  }
  TriangularSolve(in_stack_00000080,in_stack_00000078,in_stack_00000077,in_stack_00000068,this._4_4_
                 );
  for (local_24 = 0; local_24 < in_RDI->dim_; local_24 = local_24 + 1) {
    pdVar3 = std::valarray<double>::operator[](&in_RDI->work_,(long)local_24);
    dVar1 = *pdVar3;
    this_00 = in_RDX;
    std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->rowperm_,(long)local_24);
    pdVar3 = IndexedVector::operator[](this_00,in_stack_ffffffffffffff9c);
    *pdVar3 = dVar1;
  }
  IndexedVector::InvalidatePattern(in_RDX);
  return;
}

Assistant:

void ForrestTomlin::_BtranForUpdate(Int j, IndexedVector& lhs) {
    ComputeEta(j);

    // Apply update etas and solve with L'.
    Int num_updates = replaced_.size();
    for (Int k = num_updates-1; k >= 0; k--) {
        ScatterColumn(R_, k, -work_[dim_+k], work_);
        work_[replaced_[k]] = work_[dim_+k];
        work_[dim_+k] = 0.0;
    }
    TriangularSolve(L_, work_, 't', "lower", 1);

    // Return lhs without pattern.
    for (Int p = 0; p < dim_; p++)
        lhs[rowperm_[p]] = work_[p];
    lhs.InvalidatePattern();
}